

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv__fs_readdir_cleanup(uv_fs_t *req)

{
  undefined8 *puVar1;
  long lVar2;
  
  if ((undefined8 *)req->ptr != (undefined8 *)0x0) {
    puVar1 = *req->ptr;
    req->ptr = (void *)0x0;
    if (puVar1 != (undefined8 *)0x0) {
      for (lVar2 = 0; lVar2 < req->result; lVar2 = lVar2 + 1) {
        uv__free((void *)*puVar1);
        *puVar1 = 0;
        puVar1 = puVar1 + 2;
      }
    }
  }
  return;
}

Assistant:

void uv__fs_readdir_cleanup(uv_fs_t* req) {
  uv_dir_t* dir;
  uv_dirent_t* dirents;
  int i;

  if (req->ptr == NULL)
    return;

  dir = req->ptr;
  dirents = dir->dirents;
  req->ptr = NULL;

  if (dirents == NULL)
    return;

  for (i = 0; i < req->result; ++i) {
    uv__free((char*) dirents[i].name);
    dirents[i].name = NULL;
  }
}